

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O2

void __thiscall Variation::canonify(Variation *this,NamedDnaSequence *reference,bool rightmost)

{
  string *this_00;
  char cVar1;
  char cVar2;
  int iVar3;
  runtime_error *this_01;
  long lVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = *(int *)(this + 0x60);
  if (iVar3 != 0) {
    if (iVar3 == 2) {
      if (rightmost) {
        uVar5 = *(ulong *)(this + 0x30);
        while (uVar5 < reference->length) {
          cVar1 = NamedDnaSequence::operator[](reference,*(size_t *)(this + 0x28));
          cVar2 = NamedDnaSequence::operator[](reference,*(size_t *)(this + 0x30));
          if (cVar1 != cVar2) break;
          uVar5 = *(long *)(this + 0x30) + 1;
          *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
          *(ulong *)(this + 0x30) = uVar5;
        }
      }
      else {
        lVar4 = *(long *)(this + 0x28);
        while (lVar4 != 0) {
          cVar1 = NamedDnaSequence::operator[](reference,lVar4 - 1);
          cVar2 = NamedDnaSequence::operator[](reference,*(long *)(this + 0x30) - 1);
          if (cVar1 != cVar2) break;
          lVar4 = *(long *)(this + 0x28) + -1;
          *(long *)(this + 0x28) = lVar4;
          *(long *)(this + 0x30) = *(long *)(this + 0x30) + -1;
        }
      }
      iVar3 = *(int *)(this + 0x60);
    }
    if (iVar3 == 1) {
      if (*(long *)(this + 0x48) == 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_01,
                   "Variation::canonify is only applicable to insertions if sequence is known");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (string *)(this + 0x40);
      if (rightmost) {
        for (uVar5 = 0;
            (*(long *)(this + 0x28) + uVar5 != reference->length &&
            (cVar1 = *(char *)(*(long *)(this + 0x40) + uVar5 % *(ulong *)(this + 0x30)),
            cVar2 = NamedDnaSequence::operator[](reference,*(long *)(this + 0x28) + uVar5),
            cVar1 == cVar2)); uVar5 = uVar5 + 1) {
        }
        if (uVar5 == 0) {
          return;
        }
        *(ulong *)(this + 0x28) = *(long *)(this + 0x28) + uVar5;
        if (uVar5 % *(ulong *)(this + 0x30) == 0) {
          return;
        }
        std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
        std::__cxx11::string::substr((ulong)&local_90,(ulong)this_00);
        std::operator+(&local_50,&local_70,&local_90);
      }
      else {
        lVar4 = -1;
        uVar5 = 0;
        while ((uVar5 != *(ulong *)(this + 0x28) &&
               (cVar1 = *(char *)(~(uVar5 % *(ulong *)(this + 0x30)) +
                                 *(ulong *)(this + 0x30) + *(long *)(this + 0x40)),
               cVar2 = NamedDnaSequence::operator[](reference,*(ulong *)(this + 0x28) + lVar4),
               cVar1 == cVar2))) {
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + -1;
        }
        if (uVar5 == 0) {
          return;
        }
        *(ulong *)(this + 0x28) = *(long *)(this + 0x28) - uVar5;
        if (uVar5 % *(ulong *)(this + 0x30) == 0) {
          return;
        }
        std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
        std::__cxx11::string::substr((ulong)&local_90,(ulong)this_00);
        std::operator+(&local_50,&local_70,&local_90);
      }
      std::__cxx11::string::operator=(this_00,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void Variation::canonify(const NamedDnaSequence* reference, bool rightmost) {
	if (type == NONE) return;
	if (type == DELETION) {
		assert(coord1 < coord2);
		assert(coord2 <= reference->size());
		if (rightmost) {
			while (coord2 < reference->size()) {
				if ((*reference)[coord1] != (*reference)[coord2]) break;
				coord1 += 1;
				coord2 += 1;
			}
		} else {
			while (coord1 > 0) {
				if ((*reference)[coord1-1] != (*reference)[coord2-1]) break;
				coord1 -= 1;
				coord2 -= 1;
			}
		}
	}
	if (type == INSERTION) {
		if (sequence.size() == 0) throw runtime_error("Variation::canonify is only applicable to insertions if sequence is known");
		assert(coord1 <= reference->size());
		assert(sequence.size() == coord2);
		if (rightmost) {
			// number of positions by which insertion can be shifted to the right
			int shift = 0;
			while (true) {
				if (coord1 + shift == reference->size()) break;
				if (sequence[shift % coord2] != (*reference)[coord1 + shift]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 += shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(j, sequence.size()-j) + sequence.substr(0, j);
		} else {
			// number of positions by which insertion can be shifted to the left
			int shift = 0;
			while (true) {
				if (coord1 - shift == 0) break;
				if (sequence[coord2 - 1 - (shift % coord2)] != (*reference)[coord1 - shift - 1]) break;
				shift += 1;
			}
			if (shift == 0) return;
			coord1 -= shift;
			// rotate insertion sequence by shift%insertion_length characters
			int j = shift % coord2;
			if (j == 0) return;
			sequence = sequence.substr(sequence.size()-j, j) + sequence.substr(0, sequence.size()-j);
		}
	}
}